

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Aig_Man_t * Saig_ManWindowExtractNodes(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  int iVar7;
  int iVar8;
  
  Aig_ManCleanData(p);
  p_00 = Aig_ManStart(vNodes->nSize);
  pcVar2 = Abc_UtilStrsav("wnd");
  p_00->pName = pcVar2;
  p_00->pSpec = (char *)0x0;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar3 = Saig_ManWindowCollectPis(p,vNodes);
  iVar8 = pVVar3->nSize;
  iVar7 = 0;
  if (iVar8 < 1) {
    iVar8 = 0;
    iVar7 = 0;
  }
  for (; iVar8 != iVar7; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(pVVar3,iVar7);
    pAVar5 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
  }
  Vec_PtrFree(pVVar3);
  for (iVar8 = 0; iVar7 = vNodes->nSize, iVar8 < iVar7; iVar8 = iVar8 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,iVar8);
    iVar7 = Saig_ObjIsLo(p,pAVar5);
    if (iVar7 != 0) {
      pAVar6 = Aig_ObjCreateCi(p_00);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,iVar8);
    if (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      p1 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p_00,pAVar6,p1);
      (pAVar5->field_5).pData = pAVar6;
    }
    iVar7 = vNodes->nSize;
  }
  iVar7 = 0;
  pVVar3 = Saig_ManWindowCollectPos(p,vNodes,(Vec_Ptr_t **)0x0);
  iVar8 = pVVar3->nSize;
  if (pVVar3->nSize < 1) {
    iVar8 = iVar7;
  }
  for (; iVar8 != iVar7; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(pVVar3,iVar7);
    Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)pvVar4 + 0x28));
  }
  Vec_PtrFree(pVVar3);
  iVar8 = 0;
  for (iVar7 = 0; iVar7 < vNodes->nSize; iVar7 = iVar7 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,iVar7);
    iVar1 = Saig_ObjIsLo(p,pAVar5);
    if (iVar1 != 0) {
      pAVar5 = Saig_ObjLoToLi(p,pAVar5);
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      Aig_ObjCreateCo(p_00,pAVar5);
      iVar8 = iVar8 + 1;
    }
  }
  Aig_ManSetRegNum(p_00,iVar8);
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractNodes( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMatch;
    Vec_Ptr_t * vNodesPi, * vNodesPo;
    int i, nRegCount;
    Aig_ManCleanData( p ); 
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );
    // create real PIs
    vNodesPi = Saig_ManWindowCollectPis( p, vNodes );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPi, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    Vec_PtrFree( vNodesPi );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    // create POs
    vNodesPo = Saig_ManWindowCollectPos( p, vNodes, NULL );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPo, pObj, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
    Vec_PtrFree( vNodesPo );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pMatch = Saig_ObjLoToLi( p, pObj );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    return pNew;
}